

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListGraph.c
# Opt level: O0

void DFSTraverse(LGraph G)

{
  long lVar1;
  int *piVar2;
  undefined8 *puVar3;
  byte bVar4;
  int in_stack_00000008;
  undefined8 auStack_808 [201];
  int *local_1c0;
  int local_1b4;
  int *local_1b0;
  int local_1a8 [2];
  int visited [100];
  int local_c;
  int i;
  
  bVar4 = 0;
  local_1b0 = &stack0x00000008;
  for (local_c = 0; local_c < in_stack_00000008; local_c = local_c + 1) {
    local_1a8[local_c] = 0;
  }
  printf("DFS: ");
  for (local_c = 0; local_c < *local_1b0; local_c = local_c + 1) {
    if (local_1a8[local_c] == 0) {
      local_1b4 = local_c;
      local_1c0 = local_1a8;
      piVar2 = local_1b0;
      puVar3 = auStack_808;
      for (lVar1 = 0xc9; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *(undefined8 *)piVar2;
        piVar2 = piVar2 + (ulong)bVar4 * -4 + 2;
        puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
      }
      DFS(local_1b4,local_1c0);
    }
  }
  printf("\n");
  return;
}

Assistant:

void DFSTraverse(LGraph G)
{
    int i;
    int visited[MAX];       // 顶点访问标记

    // 初始化所有顶点都没有被访问
    for (i = 0; i < G.vexnum; i++)
        visited[i] = 0;

    printf("DFS: ");
    for (i = 0; i < G.vexnum; i++)
    {
        if (!visited[i])
            DFS(G, i, visited);
    }
    printf("\n");
}